

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# likelihoodfunc.hpp
# Opt level: O3

void __thiscall ftree<double>::addroute(ftree<double> *this,Node *node,uint *edgeid)

{
  _Rb_tree_header *p_Var1;
  vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::allocator<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>>
  *pvVar2;
  double *pdVar3;
  iterator __position;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  initializer_list<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  __l;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_58;
  vector<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
  local_50;
  allocator_type local_31;
  
  p_Var5 = (this->routes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->routes)._M_t._M_impl.super__Rb_tree_header;
  if (p_Var5 != (_Base_ptr)0x0) {
    pdVar3 = node->_M_current;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (*(double **)(p_Var5 + 1) >= pdVar3) {
        p_Var6 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(double **)(p_Var5 + 1) < pdVar3];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && (*(double **)(p_Var6 + 1) <= pdVar3)) {
      __position._M_current = &(p_Var6[1]._M_left)->_M_color;
      if ((_Base_ptr)__position._M_current == p_Var6[1]._M_right) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&p_Var6[1]._M_parent,
                   __position,edgeid);
      }
      else {
        *__position._M_current = *edgeid;
        p_Var6[1]._M_left = (_Base_ptr)(__position._M_current + 1);
      }
      goto LAB_00145f64;
    }
  }
  local_50.
  super__Vector_base<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = *edgeid;
  pvVar4 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
           std::
           map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::pair<const___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&this->routes,node);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            (pvVar4,&local_50,
             (undefined1 *)
             ((long)&local_50.
                     super__Vector_base<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4));
LAB_00145f64:
  local_58._M_current = node->_M_current;
  __l._M_len = 1;
  __l._M_array = &local_58;
  std::
  vector<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::vector(&local_50,__l,&local_31);
  std::
  vector<std::vector<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,_std::allocator<std::vector<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>_>_>
  ::resize(&this->ports,
           (long)(this->edges).
                 super__Vector_base<std::array<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_2UL>,_std::allocator<std::array<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->edges).
                 super__Vector_base<std::array<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_2UL>,_std::allocator<std::array<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4);
  pvVar2 = (vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::allocator<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>>
            *)((this->ports).
               super__Vector_base<std::vector<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,_std::allocator<std::vector<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + *edgeid);
  std::
  vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::allocator<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>>
  ::
  _M_range_insert<__gnu_cxx::__normal_iterator<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>const*,std::vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::allocator<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>>>>
            (pvVar2,*(undefined8 *)(pvVar2 + 8),
             CONCAT44(local_50.
                      super__Vector_base<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                      (uint)local_50.
                            super__Vector_base<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start),
             local_50.
             super__Vector_base<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((void *)CONCAT44(local_50.
                       super__Vector_base<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       (uint)local_50.
                             super__Vector_base<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_50.
                                     super__Vector_base<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (uint)local_50.
                                           super__Vector_base<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start));
  }
  p_Var5 = (this->routes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    pdVar3 = (this->edges).
             super__Vector_base<std::array<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_2UL>,_std::allocator<std::array<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[*edgeid]._M_elems[0]._M_current;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (*(double **)(p_Var5 + 1) >= pdVar3) {
        p_Var6 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(double **)(p_Var5 + 1) < pdVar3];
    } while (p_Var5 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var6 != p_Var1) &&
        ((double *)((_Rb_tree_header *)p_Var6)->_M_node_count <= pdVar3)) &&
       (*(uint **)((long)p_Var6 + 0x28 + 8) != *(uint **)((long)p_Var6 + 0x28))) {
      addroute(this,node,*(uint **)((long)p_Var6 + 0x28));
    }
  }
  return;
}

Assistant:

inline void addroute(const Node& node, const uint& edgeid) {
      auto it = routes.find(node);
      if(it != routes.end()) {
	it->second.push_back(edgeid);
      } else {
        routes[node] = {edgeid};
      }
      addport(edgeid, {node});
      //also update this node's route to former edges
      const auto& edge = edges[edgeid];
      const auto& itfnode = routes.find(edge[0]);
      //if such former edge exist and the joint node is not the headnode
      if(itfnode != routes.end() && itfnode->second.size()) {
	//we assume that in the array of edges each node map to, the smaller
	//the corresponding index is, the closer such edge is to the node
	addroute(node, (itfnode->second)[0]);
      }
    }